

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void mergesort_lcp_2way(uchar **strings,size_t n)

{
  MergeResult MVar1;
  lcp_t *lcp_input_00;
  lcp_t *lcp_output_00;
  uchar **strings_output;
  MergeResult m;
  uchar **tmp;
  lcp_t *lcp_output;
  lcp_t *lcp_input;
  size_t n_local;
  uchar **strings_local;
  
  lcp_input_00 = (lcp_t *)malloc(n << 3);
  lcp_output_00 = (lcp_t *)malloc(n << 3);
  strings_output = (uchar **)malloc(n << 3);
  MVar1 = mergesort_lcp_2way<false>(strings,strings_output,lcp_input_00,lcp_output_00,n);
  if (MVar1 == SortedInTemp) {
    memcpy(strings,strings_output,n << 3);
  }
  free(lcp_input_00);
  free(lcp_output_00);
  free(strings_output);
  return;
}

Assistant:

void
mergesort_lcp_2way(unsigned char** strings, size_t n)
{
	lcp_t* lcp_input  = static_cast<lcp_t*>(malloc(n*sizeof(lcp_t)));
	lcp_t* lcp_output = static_cast<lcp_t*>(malloc(n*sizeof(lcp_t)));
	unsigned char** tmp = static_cast<unsigned char**>(
			malloc(n*sizeof(unsigned char*)));
	const MergeResult m = mergesort_lcp_2way<false>(strings, tmp,
			lcp_input, lcp_output, n);
	if (m == SortedInTemp) {
		(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
	}
	free(lcp_input);
	free(lcp_output);
	free(tmp);
}